

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O0

int __thiscall Fl_FLTK_File_Chooser::show(Fl_FLTK_File_Chooser *this)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Fl_File_Chooser *pFVar4;
  undefined1 local_a8 [8];
  stat buf;
  Fl_FLTK_File_Chooser *this_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)this;
  if (this->_parsedfilt != (char *)0x0) {
    Fl_File_Chooser::filter(this->_file_chooser,this->_parsedfilt);
  }
  Fl_File_Chooser::filter_value(this->_file_chooser,this->_filtvalue);
  if ((this->_directory == (char *)0x0) || (*this->_directory == '\0')) {
    Fl_File_Chooser::directory(this->_file_chooser,this->_prevvalue);
  }
  else {
    Fl_File_Chooser::directory(this->_file_chooser,this->_directory);
  }
  if (this->_preset_file != (char *)0x0) {
    Fl_File_Chooser::value(this->_file_chooser,this->_preset_file);
  }
  pFVar4 = this->_file_chooser;
  uVar1 = options(this);
  Fl_File_Chooser::preview(pFVar4,(uint)((uVar1 & 4) != 0));
  uVar1 = options(this);
  if ((uVar1 & 2) != 0) {
    pFVar4 = this->_file_chooser;
    uVar1 = Fl_File_Chooser::type(this->_file_chooser);
    Fl_File_Chooser::type(pFVar4,uVar1 | 2);
  }
  Fl_File_Chooser::show(this->_file_chooser);
  while( true ) {
    pFVar4 = this->_file_chooser;
    iVar2 = Fl_File_Chooser::shown(pFVar4);
    if (iVar2 == 0) break;
    Fl::wait(pFVar4);
  }
  pcVar3 = Fl_File_Chooser::value(this->_file_chooser,1);
  if ((pcVar3 != (char *)0x0) &&
     (pcVar3 = Fl_File_Chooser::value(this->_file_chooser,1), *pcVar3 != '\0')) {
    pcVar3 = strfree(this->_prevvalue);
    this->_prevvalue = pcVar3;
    pcVar3 = Fl_File_Chooser::value(this->_file_chooser,1);
    pcVar3 = strnew(pcVar3);
    this->_prevvalue = pcVar3;
    iVar2 = Fl_File_Chooser::filter_value(this->_file_chooser);
    this->_filtvalue = iVar2;
    uVar1 = options(this);
    if (((uVar1 & 1) != 0) && (iVar2 = type(this), iVar2 == 4)) {
      pcVar3 = Fl_File_Chooser::value(this->_file_chooser,1);
      iVar2 = stat64(pcVar3,(stat64 *)local_a8);
      if (((iVar2 != -1) && (((uint)buf.st_nlink & 0x8000) != 0)) &&
         (iVar2 = exist_dialog(this), iVar2 == 0)) {
        return 1;
      }
    }
  }
  iVar2 = Fl_File_Chooser::count(this->_file_chooser);
  this_local._4_4_ = (uint)(iVar2 == 0);
  return this_local._4_4_;
}

Assistant:

int Fl_FLTK_File_Chooser::show() {

  // FILTER
  if ( _parsedfilt ) {
    _file_chooser->filter(_parsedfilt);
  }

  // FILTER VALUE
  //     Set this /after/ setting the filter
  //
  _file_chooser->filter_value(_filtvalue);

  // DIRECTORY
  if ( _directory && _directory[0] ) {
    _file_chooser->directory(_directory);
  } else {
    _file_chooser->directory(_prevvalue);
  }

  // PRESET FILE
  if ( _preset_file ) {
    _file_chooser->value(_preset_file);
  }

  // OPTIONS: PREVIEW
  _file_chooser->preview( (options() & Fl_Native_File_Chooser::PREVIEW) ? 1 : 0);

  // OPTIONS: NEW FOLDER
  if ( options() & Fl_Native_File_Chooser::NEW_FOLDER )
    _file_chooser->type(_file_chooser->type() | Fl_File_Chooser::CREATE);	// on
  
  // SHOW
  _file_chooser->show();

  // BLOCK WHILE BROWSER SHOWN
  while ( _file_chooser->shown() ) {
    Fl::wait();
  }

  if ( _file_chooser->value() && _file_chooser->value()[0] ) {
    _prevvalue = strfree(_prevvalue);
    _prevvalue = strnew(_file_chooser->value());
    _filtvalue = _file_chooser->filter_value(); // update filter value

    // HANDLE SHOWING 'SaveAs' CONFIRM
    if ( options() & Fl_Native_File_Chooser::SAVEAS_CONFIRM && type() == Fl_Native_File_Chooser::BROWSE_SAVE_FILE ) {
      struct stat buf;
      if ( stat(_file_chooser->value(), &buf) != -1 ) {
        if ( buf.st_mode & S_IFREG ) {    // Regular file + exists?
          if ( exist_dialog() == 0 ) {
            return(1);
          }
        }
      }
    }
  }

  if ( _file_chooser->count() ) return(0);
  else return(1);
}